

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaAddAllocatedMessage
          (Reflection *this,Message *message,FieldDescriptor *field,Message *new_entry)

{
  bool bVar1;
  CppType CVar2;
  Reflection *pRVar3;
  Descriptor *actual;
  Descriptor *pDVar4;
  ExtensionSet *this_00;
  MapFieldBase *this_01;
  RepeatedPtrFieldBase *local_30;
  RepeatedPtrFieldBase *repeated;
  Message *new_entry_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar3 = Message::GetReflection(message);
  if (this != pRVar3) {
    pDVar4 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar4,actual,field,"UnsafeArenaAddAllocatedMessage");
  }
  pDVar4 = FieldDescriptor::containing_type(field);
  if (pDVar4 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",
               "Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (!bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",
               "Field is singular; the method requires a repeated field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"UnsafeArenaAddAllocatedMessage",CPPTYPE_MESSAGE);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    internal::ExtensionSet::UnsafeArenaAddAllocatedMessage
              (this_00,field,&new_entry->super_MessageLite);
  }
  else {
    bVar1 = anon_unknown_6::IsMapFieldInApi(field);
    if (bVar1) {
      this_01 = MutableRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
      local_30 = internal::MapFieldBase::MutableRepeatedField(this_01);
    }
    else {
      local_30 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
    }
    internal::RepeatedPtrFieldBase::
    UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
              (local_30,new_entry);
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaAddAllocatedMessage(Message* message,
                                                const FieldDescriptor* field,
                                                Message* new_entry) const {
  USAGE_MUTABLE_CHECK_ALL(UnsafeArenaAddAllocatedMessage, REPEATED, MESSAGE);

  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaAddAllocatedMessage(field,
                                                                 new_entry);
  } else {
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message>>(new_entry);
  }
}